

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x11_joystick.c
# Opt level: O0

int openJoystickDevice(int joy,char *path)

{
  int iVar1;
  char *pcVar2;
  float *pfVar3;
  uchar *puVar4;
  int local_130;
  int local_12c;
  int version;
  int fd;
  char name [256];
  char local_1a;
  char local_19;
  char buttonCount;
  char *pcStack_18;
  char axisCount;
  char *path_local;
  int joy_local;
  
  pcStack_18 = path;
  path_local._0_4_ = joy;
  local_12c = open(path,0x800);
  if (local_12c == -1) {
    path_local._4_4_ = 0;
  }
  else {
    _glfw.x11.joystick[(int)path_local].fd = local_12c;
    ioctl(local_12c,0x80046a01,&local_130);
    if (local_130 < 0x10000) {
      close(local_12c);
      path_local._4_4_ = 0;
    }
    else {
      iVar1 = ioctl(local_12c,0x81006a13,&version);
      if (iVar1 < 0) {
        strncpy((char *)&version,"Unknown",0x100);
      }
      pcVar2 = strdup((char *)&version);
      _glfw.x11.joystick[(int)path_local].name = pcVar2;
      ioctl(local_12c,0x80016a11,&local_19);
      _glfw.x11.joystick[(int)path_local].axisCount = (int)local_19;
      ioctl(local_12c,0x80016a12,&local_1a);
      _glfw.x11.joystick[(int)path_local].buttonCount = (int)local_1a;
      pfVar3 = (float *)calloc((long)local_19,4);
      _glfw.x11.joystick[(int)path_local].axes = pfVar3;
      puVar4 = (uchar *)calloc((long)local_1a,1);
      _glfw.x11.joystick[(int)path_local].buttons = puVar4;
      _glfw.x11.joystick[(int)path_local].present = 1;
      path_local._4_4_ = 1;
    }
  }
  return path_local._4_4_;
}

Assistant:

static int openJoystickDevice(int joy, const char* path)
{
#ifdef __linux__
    char axisCount, buttonCount;
    char name[256];
    int fd, version;

    fd = open(path, O_RDONLY | O_NONBLOCK);
    if (fd == -1)
        return GL_FALSE;

    _glfw.x11.joystick[joy].fd = fd;

    // Verify that the joystick driver version is at least 1.0
    ioctl(fd, JSIOCGVERSION, &version);
    if (version < 0x010000)
    {
        // It's an old 0.x interface (we don't support it)
        close(fd);
        return GL_FALSE;
    }

    if (ioctl(fd, JSIOCGNAME(sizeof(name)), name) < 0)
        strncpy(name, "Unknown", sizeof(name));

    _glfw.x11.joystick[joy].name = strdup(name);

    ioctl(fd, JSIOCGAXES, &axisCount);
    _glfw.x11.joystick[joy].axisCount = (int) axisCount;

    ioctl(fd, JSIOCGBUTTONS, &buttonCount);
    _glfw.x11.joystick[joy].buttonCount = (int) buttonCount;

    _glfw.x11.joystick[joy].axes = calloc(axisCount, sizeof(float));
    _glfw.x11.joystick[joy].buttons = calloc(buttonCount, 1);

    _glfw.x11.joystick[joy].present = GL_TRUE;
#endif // __linux__

    return GL_TRUE;
}